

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrypt.cc
# Opt level: O0

void salsa208_word_specification(block_t *inout)

{
  uint32_t uVar1;
  int local_58;
  int local_54;
  int i_1;
  int i;
  block_t x;
  block_t *inout_local;
  
  x.words._56_8_ = inout;
  OPENSSL_memcpy(&i_1,inout,0x40);
  for (local_54 = 8; 0 < local_54; local_54 = local_54 + -2) {
    uVar1 = CRYPTO_rotl_u32(i_1 + x.words[10],7);
    x.words[2] = uVar1 ^ x.words[2];
    uVar1 = CRYPTO_rotl_u32(x.words[2] + i_1,9);
    x.words[6] = uVar1 ^ x.words[6];
    uVar1 = CRYPTO_rotl_u32(x.words[6] + x.words[2],0xd);
    x.words[10] = uVar1 ^ x.words[10];
    uVar1 = CRYPTO_rotl_u32(x.words[10] + x.words[6],0x12);
    i_1 = uVar1 ^ i_1;
    uVar1 = CRYPTO_rotl_u32(x.words[3] + i,7);
    x.words[7] = uVar1 ^ x.words[7];
    uVar1 = CRYPTO_rotl_u32(x.words[7] + x.words[3],9);
    x.words[0xb] = uVar1 ^ x.words[0xb];
    uVar1 = CRYPTO_rotl_u32(x.words[0xb] + x.words[7],0xd);
    i = uVar1 ^ i;
    uVar1 = CRYPTO_rotl_u32(i + x.words[0xb],0x12);
    x.words[3] = uVar1 ^ x.words[3];
    uVar1 = CRYPTO_rotl_u32(x.words[8] + x.words[4],7);
    x.words[0xc] = uVar1 ^ x.words[0xc];
    uVar1 = CRYPTO_rotl_u32(x.words[0xc] + x.words[8],9);
    x.words[0] = uVar1 ^ x.words[0];
    uVar1 = CRYPTO_rotl_u32(x.words[0] + x.words[0xc],0xd);
    x.words[4] = uVar1 ^ x.words[4];
    uVar1 = CRYPTO_rotl_u32(x.words[4] + x.words[0],0x12);
    x.words[8] = uVar1 ^ x.words[8];
    uVar1 = CRYPTO_rotl_u32(x.words[0xd] + x.words[9],7);
    x.words[1] = uVar1 ^ x.words[1];
    uVar1 = CRYPTO_rotl_u32(x.words[1] + x.words[0xd],9);
    x.words[5] = uVar1 ^ x.words[5];
    uVar1 = CRYPTO_rotl_u32(x.words[5] + x.words[1],0xd);
    x.words[9] = uVar1 ^ x.words[9];
    uVar1 = CRYPTO_rotl_u32(x.words[9] + x.words[5],0x12);
    x.words[0xd] = uVar1 ^ x.words[0xd];
    uVar1 = CRYPTO_rotl_u32(i_1 + x.words[1],7);
    i = uVar1 ^ i;
    uVar1 = CRYPTO_rotl_u32(i + i_1,9);
    x.words[0] = uVar1 ^ x.words[0];
    uVar1 = CRYPTO_rotl_u32(x.words[0] + i,0xd);
    x.words[1] = uVar1 ^ x.words[1];
    uVar1 = CRYPTO_rotl_u32(x.words[1] + x.words[0],0x12);
    i_1 = uVar1 ^ i_1;
    uVar1 = CRYPTO_rotl_u32(x.words[3] + x.words[2],7);
    x.words[4] = uVar1 ^ x.words[4];
    uVar1 = CRYPTO_rotl_u32(x.words[4] + x.words[3],9);
    x.words[5] = uVar1 ^ x.words[5];
    uVar1 = CRYPTO_rotl_u32(x.words[5] + x.words[4],0xd);
    x.words[2] = uVar1 ^ x.words[2];
    uVar1 = CRYPTO_rotl_u32(x.words[2] + x.words[5],0x12);
    x.words[3] = uVar1 ^ x.words[3];
    uVar1 = CRYPTO_rotl_u32(x.words[8] + x.words[7],7);
    x.words[9] = uVar1 ^ x.words[9];
    uVar1 = CRYPTO_rotl_u32(x.words[9] + x.words[8],9);
    x.words[6] = uVar1 ^ x.words[6];
    uVar1 = CRYPTO_rotl_u32(x.words[6] + x.words[9],0xd);
    x.words[7] = uVar1 ^ x.words[7];
    uVar1 = CRYPTO_rotl_u32(x.words[7] + x.words[6],0x12);
    x.words[8] = uVar1 ^ x.words[8];
    uVar1 = CRYPTO_rotl_u32(x.words[0xd] + x.words[0xc],7);
    x.words[10] = uVar1 ^ x.words[10];
    uVar1 = CRYPTO_rotl_u32(x.words[10] + x.words[0xd],9);
    x.words[0xb] = uVar1 ^ x.words[0xb];
    uVar1 = CRYPTO_rotl_u32(x.words[0xb] + x.words[10],0xd);
    x.words[0xc] = uVar1 ^ x.words[0xc];
    uVar1 = CRYPTO_rotl_u32(x.words[0xc] + x.words[0xb],0x12);
    x.words[0xd] = uVar1 ^ x.words[0xd];
  }
  for (local_58 = 0; local_58 < 0x10; local_58 = local_58 + 1) {
    *(int *)(x.words._56_8_ + (long)local_58 * 4) =
         (&i_1)[local_58] + *(int *)(x.words._56_8_ + (long)local_58 * 4);
  }
  return;
}

Assistant:

static void salsa208_word_specification(block_t *inout) {
  block_t x;
  OPENSSL_memcpy(&x, inout, sizeof(x));

  for (int i = 8; i > 0; i -= 2) {
    x.words[4] ^= CRYPTO_rotl_u32(x.words[0] + x.words[12], 7);
    x.words[8] ^= CRYPTO_rotl_u32(x.words[4] + x.words[0], 9);
    x.words[12] ^= CRYPTO_rotl_u32(x.words[8] + x.words[4], 13);
    x.words[0] ^= CRYPTO_rotl_u32(x.words[12] + x.words[8], 18);
    x.words[9] ^= CRYPTO_rotl_u32(x.words[5] + x.words[1], 7);
    x.words[13] ^= CRYPTO_rotl_u32(x.words[9] + x.words[5], 9);
    x.words[1] ^= CRYPTO_rotl_u32(x.words[13] + x.words[9], 13);
    x.words[5] ^= CRYPTO_rotl_u32(x.words[1] + x.words[13], 18);
    x.words[14] ^= CRYPTO_rotl_u32(x.words[10] + x.words[6], 7);
    x.words[2] ^= CRYPTO_rotl_u32(x.words[14] + x.words[10], 9);
    x.words[6] ^= CRYPTO_rotl_u32(x.words[2] + x.words[14], 13);
    x.words[10] ^= CRYPTO_rotl_u32(x.words[6] + x.words[2], 18);
    x.words[3] ^= CRYPTO_rotl_u32(x.words[15] + x.words[11], 7);
    x.words[7] ^= CRYPTO_rotl_u32(x.words[3] + x.words[15], 9);
    x.words[11] ^= CRYPTO_rotl_u32(x.words[7] + x.words[3], 13);
    x.words[15] ^= CRYPTO_rotl_u32(x.words[11] + x.words[7], 18);
    x.words[1] ^= CRYPTO_rotl_u32(x.words[0] + x.words[3], 7);
    x.words[2] ^= CRYPTO_rotl_u32(x.words[1] + x.words[0], 9);
    x.words[3] ^= CRYPTO_rotl_u32(x.words[2] + x.words[1], 13);
    x.words[0] ^= CRYPTO_rotl_u32(x.words[3] + x.words[2], 18);
    x.words[6] ^= CRYPTO_rotl_u32(x.words[5] + x.words[4], 7);
    x.words[7] ^= CRYPTO_rotl_u32(x.words[6] + x.words[5], 9);
    x.words[4] ^= CRYPTO_rotl_u32(x.words[7] + x.words[6], 13);
    x.words[5] ^= CRYPTO_rotl_u32(x.words[4] + x.words[7], 18);
    x.words[11] ^= CRYPTO_rotl_u32(x.words[10] + x.words[9], 7);
    x.words[8] ^= CRYPTO_rotl_u32(x.words[11] + x.words[10], 9);
    x.words[9] ^= CRYPTO_rotl_u32(x.words[8] + x.words[11], 13);
    x.words[10] ^= CRYPTO_rotl_u32(x.words[9] + x.words[8], 18);
    x.words[12] ^= CRYPTO_rotl_u32(x.words[15] + x.words[14], 7);
    x.words[13] ^= CRYPTO_rotl_u32(x.words[12] + x.words[15], 9);
    x.words[14] ^= CRYPTO_rotl_u32(x.words[13] + x.words[12], 13);
    x.words[15] ^= CRYPTO_rotl_u32(x.words[14] + x.words[13], 18);
  }

  for (int i = 0; i < 16; ++i) {
    inout->words[i] += x.words[i];
  }
}